

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_table_segment_info(table_segment sec)

{
  uint32 *puVar1;
  ulong uVar2;
  
  if (sec.table_segment_count != 0) {
    puVar1 = &((sec.table_segment_addr)->limit).max;
    uVar2 = 0;
    do {
      printf("  - table[%d]: type=funcref ",uVar2 & 0xffffffff);
      printf("min=%d",(ulong)puVar1[-1]);
      if (((limit *)(puVar1 + -2))->tag == '\x01') {
        printf(" max=%d",(ulong)*puVar1);
      }
      putchar(10);
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + 4;
    } while ((sec._0_8_ & 0xffffffff) != uVar2);
  }
  return;
}

Assistant:

void print_table_segment_info(table_segment sec) {
    table_pointer table_segment_addr;
    for (int i = 0; i < sec.table_segment_count; ++i) {
        table_segment_addr = sec.table_segment_addr + i;
        printf("  - table[%d]: type=funcref ", i);
        printf("min=%d", table_segment_addr->limit.min);
        if (table_segment_addr->limit.tag == min_and_max)
            printf(" max=%d", table_segment_addr->limit.max);
        puts("");
    }
}